

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

raw_os_ostream * getInstName_abi_cxx11_(Value *val)

{
  bool bVar1;
  pointer ppVar2;
  BasicBlock *this;
  ulong uVar3;
  raw_os_ostream *in_RDI;
  StringRef *fun;
  Instruction *I_1;
  size_t m;
  size_t n;
  __string_type str;
  CVariableDecl *decl;
  iterator Vit;
  DebugLoc *DL;
  Instruction *I;
  raw_os_ostream ro;
  ostringstream ostr;
  string *funstr;
  raw_ostream *in_stack_fffffffffffffd48;
  raw_os_ostream *Str;
  raw_ostream *in_stack_fffffffffffffd60;
  StringRef *in_stack_fffffffffffffd78;
  undefined1 local_278 [16];
  undefined1 *local_268;
  ret_type local_260;
  undefined4 local_254;
  string local_250 [32];
  size_t local_230;
  size_t local_228;
  string local_220 [32];
  CVariableDecl *local_200;
  _Self local_1f8;
  ret_type local_1f0;
  _Self local_1e8;
  DebugLoc *local_1e0;
  ret_type local_1d8;
  raw_os_ostream local_1d0 [72];
  ostringstream local_188 [392];
  
  Str = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  llvm::raw_os_ostream::raw_os_ostream(in_RDI,(ostream *)in_stack_fffffffffffffd48);
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x15e389);
  if (bVar1) {
    local_1d8 = llvm::dyn_cast<llvm::Instruction,llvm::Value_const>((Value *)in_RDI);
    if (local_1d8 != (ret_type)0x0) {
      local_1e0 = llvm::Instruction::getDebugLoc(local_1d8);
      bVar1 = llvm::DebugLoc::operator_cast_to_bool((DebugLoc *)0x15e3d8);
      if (bVar1) {
        llvm::DebugLoc::getLine();
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_RDI,(uint)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        in_stack_fffffffffffffd48 =
             llvm::raw_ostream::operator<<(in_stack_fffffffffffffd60,(char *)Str);
        llvm::DebugLoc::getCol();
        llvm::raw_ostream::operator<<
                  ((raw_ostream *)in_RDI,(uint)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      }
      else {
        local_1f0 = local_1d8;
        local_1e8._M_node =
             (_Base_ptr)
             std::
             map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
             ::find((map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                     *)in_stack_fffffffffffffd48,(key_type *)0x15e44e);
        local_1f8._M_node =
             (_Base_ptr)
             std::
             map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
             ::end((map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                    *)in_stack_fffffffffffffd48);
        bVar1 = std::operator!=(&local_1e8,&local_1f8);
        if (bVar1) {
          ppVar2 = std::_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>
                               *)0x15e492);
          local_200 = &ppVar2->second;
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_RDI,(uint)((ulong)in_stack_fffffffffffffd48 >> 0x20));
          llvm::raw_ostream::operator<<(in_stack_fffffffffffffd60,(char *)Str);
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_RDI,(uint)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        }
        else {
          llvm::raw_ostream::operator<<(in_stack_fffffffffffffd60,(char *)Str);
          llvm::operator<<((raw_ostream *)in_RDI,(Value *)in_stack_fffffffffffffd48);
        }
      }
    }
  }
  else {
    llvm::operator<<((raw_ostream *)in_RDI,(Value *)in_stack_fffffffffffffd48);
  }
  llvm::raw_ostream::flush((raw_ostream *)in_RDI);
  std::__cxx11::ostringstream::str();
  local_228 = count_ws((string *)in_RDI);
  local_230 = trim_name_idx((string *)in_stack_fffffffffffffd48);
  if (local_228 != 0) {
    std::__cxx11::string::substr((ulong)local_250,(ulong)local_220);
    std::__cxx11::string::operator=(local_220,local_250);
    std::__cxx11::string::~string(local_250);
  }
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x15e5c6);
  if (bVar1) {
    std::__cxx11::string::string((string *)in_RDI,local_220);
  }
  else {
    local_260 = llvm::dyn_cast<llvm::Instruction,llvm::Value_const>((Value *)in_RDI);
    if (local_260 == (ret_type)0x0) {
      std::__cxx11::string::string((string *)in_RDI,local_220);
    }
    else {
      this = llvm::Instruction::getParent(local_260);
      llvm::BasicBlock::getParent(this);
      local_278 = llvm::Value::getName();
      local_268 = local_278;
      llvm::StringRef::str_abi_cxx11_(in_stack_fffffffffffffd78);
      uVar3 = std::__cxx11::string::length();
      if (0xf < uVar3) {
        std::__cxx11::string::substr((ulong)&stack0xfffffffffffffd60,(ulong)in_RDI);
        std::__cxx11::string::operator=((string *)in_RDI,(string *)&stack0xfffffffffffffd60);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd60);
      }
      std::__cxx11::string::operator+=((string *)in_RDI,"::");
      std::__cxx11::string::operator+=((string *)in_RDI,local_220);
    }
  }
  local_254 = 1;
  std::__cxx11::string::~string(local_220);
  llvm::raw_os_ostream::~raw_os_ostream(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return Str;
}

Assistant:

static std::string getInstName(const llvm::Value *val) {
    assert(val);
    std::ostringstream ostr;
    llvm::raw_os_ostream ro(ostr);

    if (dump_c_lines) {
        if (const auto *I = llvm::dyn_cast<llvm::Instruction>(val)) {
            const auto &DL = I->getDebugLoc();
            if (DL) {
                ro << DL.getLine() << ":" << DL.getCol();
            } else {
                auto Vit = valuesToVars.find(I);
                if (Vit != valuesToVars.end()) {
                    auto &decl = Vit->second;
                    ro << decl.line << ":" << decl.col;
                } else {
                    ro << "(no dbg) ";
                    ro << *val;
                }
            }
        }
    } else {
        ro << *val;
    }

    ro.flush();

    auto str = ostr.str();
    auto n = count_ws(str);
    auto m = trim_name_idx(str);
    if (n > 0)
        str = str.substr(n, m);

    if (dump_c_lines)
        return str;

    if (const auto *I = llvm::dyn_cast<llvm::Instruction>(val)) {
        const auto &fun = I->getParent()->getParent()->getName();
        auto funstr = fun.str();
        if (funstr.length() > 15)
            funstr = funstr.substr(0, 15);
        funstr += "::";
        funstr += str;
        return funstr;
    }

    return str;
}